

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

void link_dowork(LINK_HANDLE link)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE pLVar3;
  ASYNC_OPERATION_HANDLE async_operation;
  LOGGER_LOG l_2;
  DELIVERY_INSTANCE *delivery_instance;
  ASYNC_OPERATION_HANDLE delivery_instance_async_operation;
  LIST_ITEM_HANDLE next_item;
  LIST_ITEM_HANDLE item;
  LOGGER_LOG l_1;
  tickcounter_ms_t current_tick;
  LOGGER_LOG l;
  LINK_HANDLE link_local;
  
  l = (LOGGER_LOG)link;
  if (link == (LINK_HANDLE)0x0) {
    current_tick = (tickcounter_ms_t)xlogging_get_log_function();
    if ((LOGGER_LOG)current_tick != (LOGGER_LOG)0x0) {
      (*(code *)current_tick)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                 ,"link_dowork",0x647,1,"NULL link");
    }
  }
  else {
    iVar1 = tickcounter_get_current_ms(link->tick_counter,(tickcounter_ms_t *)&l_1);
    if (iVar1 == 0) {
      pLVar3 = singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)(l + 0x38));
      while (next_item = pLVar3, next_item != (LIST_ITEM_HANDLE)0x0) {
        pLVar3 = singlylinkedlist_get_next_item(next_item);
        async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(next_item);
        if ((((async_operation != (ASYNC_OPERATION_HANDLE)0x0) &&
             (async_operation != (ASYNC_OPERATION_HANDLE)0xfffffffffffffff8)) &&
            (async_operation[6].async_operation_cancel_handler !=
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0)) &&
           (async_operation[6].async_operation_cancel_handler <=
            l_1 + -(long)async_operation[5].async_operation_cancel_handler)) {
          if (async_operation[2].async_operation_cancel_handler !=
              (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
            (*async_operation[2].async_operation_cancel_handler)
                      ((ASYNC_OPERATION_HANDLE)async_operation[3].async_operation_cancel_handler);
          }
          iVar1 = singlylinkedlist_remove(*(SINGLYLINKEDLIST_HANDLE *)(l + 0x38),next_item);
          if ((iVar1 != 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                      ,"link_dowork",0x668,1,"Cannot remove item from list");
          }
          async_operation_destroy(async_operation);
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_dowork",0x64f,1,"Cannot get tick counter value");
      }
    }
  }
  return;
}

Assistant:

void link_dowork(LINK_HANDLE link)
{
    if (link == NULL)
    {
        LogError("NULL link");
    }
    else
    {
        tickcounter_ms_t current_tick;

        if (tickcounter_get_current_ms(link->tick_counter, &current_tick) != 0)
        {
            LogError("Cannot get tick counter value");
        }
        else
        {
            // go through all and find timed out deliveries
            LIST_ITEM_HANDLE item = singlylinkedlist_get_head_item(link->pending_deliveries);
            while (item != NULL)
            {
                LIST_ITEM_HANDLE next_item = singlylinkedlist_get_next_item(item);
                ASYNC_OPERATION_HANDLE delivery_instance_async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item);
                if (delivery_instance_async_operation != NULL)
                {
                    DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, delivery_instance_async_operation);

                    if ((delivery_instance != NULL) &&
                        (delivery_instance->timeout != 0) &&
                        (current_tick - delivery_instance->start_tick >= delivery_instance->timeout))
                    {
                        if (delivery_instance->on_delivery_settled != NULL)
                        {
                            delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, LINK_DELIVERY_SETTLE_REASON_TIMEOUT, NULL);
                        }

                        if (singlylinkedlist_remove(link->pending_deliveries, item) != 0)
                        {
                            LogError("Cannot remove item from list");
                        }

                        async_operation_destroy(delivery_instance_async_operation);
                    }
                }

                item = next_item;
            }
        }
    }
}